

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O0

void Gia_MmStepEntryRecycle(Gia_MmStep_t *p,char *pEntry,int nBytes)

{
  int nBytes_local;
  char *pEntry_local;
  Gia_MmStep_t *p_local;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    Gia_MmFixedEntryRecycle(p->pMap[nBytes],pEntry);
  }
  return;
}

Assistant:

void Gia_MmStepEntryRecycle( Gia_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Gia_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}